

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

UA_StatusCode socket_write(UA_Connection *connection,UA_ByteString *buf)

{
  bool bVar1;
  ssize_t sVar2;
  int *piVar3;
  size_t nWritten;
  ulong uVar4;
  
  uVar4 = 0;
LAB_0012a298:
  do {
    sVar2 = send(connection->sockfd,buf->data + uVar4,buf->length - uVar4,0);
    bVar1 = true;
    if (sVar2 < 0) {
      piVar3 = __errno_location();
      if ((*piVar3 != 4) && (*piVar3 != 0xb)) {
        (*connection->close)(connection);
        connection->state = UA_CONNECTION_CLOSED;
        shutdown(connection->sockfd,2);
        close(connection->sockfd);
        deleteMembers_noInit(buf,UA_TYPES + 0xe);
        buf->length = 0;
        buf->data = (UA_Byte *)0x0;
        bVar1 = false;
      }
    }
    if (bVar1) {
      if (sVar2 < 0) goto LAB_0012a298;
      uVar4 = uVar4 + sVar2;
    }
    if (!bVar1) {
      return 0x80ae0000;
    }
    if (buf->length <= uVar4) {
      deleteMembers_noInit(buf,UA_TYPES + 0xe);
      buf->length = 0;
      buf->data = (UA_Byte *)0x0;
      return 0;
    }
  } while( true );
}

Assistant:

static UA_StatusCode
socket_write(UA_Connection *connection, UA_ByteString *buf) {
    size_t nWritten = 0;
    do {
        ssize_t n = 0;
        do {
        /* If the OS throws EMSGSIZE, force a smaller packet size:
         * size_t bytes_to_send = buf->length - nWritten >  1024 ? 1024 : buf->length - nWritten; */
            size_t bytes_to_send = buf->length - nWritten;
            n = send((SOCKET)connection->sockfd, (const char*)buf->data + nWritten,
                     WIN32_INT bytes_to_send, 0);
            if(n < 0 && errno__ != INTERRUPTED && errno__ != AGAIN) {
                connection->close(connection);
                socket_close(connection);
                UA_ByteString_deleteMembers(buf);
                return UA_STATUSCODE_BADCONNECTIONCLOSED;
            }
        } while(n < 0);
        nWritten += (size_t)n;
    } while(nWritten < buf->length);
    UA_ByteString_deleteMembers(buf);
    return UA_STATUSCODE_GOOD;
}